

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O1

void __thiscall PKCS12Test_TestWindowsCompat_Test::TestBody(PKCS12Test_TestWindowsCompat_Test *this)

{
  int iVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  EVP_PKEY *key;
  X509 *cert;
  AssertionResult gtest_ar;
  UniquePtr<PKCS12> p12;
  UniquePtr<EVP_PKEY> delete_key;
  UniquePtr<X509> delete_cert;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  UniquePtr<BIO> bio;
  stack_st_X509 *ca_certs;
  string data;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_50;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_48;
  unique_ptr<bio_st,_bssl::internal::Deleter> local_40;
  _Head_base<0UL,_stack_st_X509_*,_false> local_38;
  string local_30;
  
  GetTestData_abi_cxx11_(&local_30,"crypto/pkcs8/test/windows.p12");
  local_40._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new_mem_buf(local_30._M_dataplus._M_p,(int)local_30._M_string_length);
  local_b0._M_head_impl._0_1_ =
       (tuple<bio_st_*,_bssl::internal::Deleter>)
       local_40._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (_Head_base<0UL,_bio_st_*,_false>)0x0;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<bio_st_*,_bssl::internal::Deleter>)
      local_40._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (_Head_base<0UL,_bio_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_b0,(AssertionResult *)0x5b8487,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x42,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if ((PKCS12 *)local_68._M_head_impl != (PKCS12 *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    goto LAB_00356e95;
  }
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       d2i_PKCS12_bio((BIO *)local_40._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(PKCS12 **)0x0);
  local_b0._M_head_impl._0_1_ = (PKCS12 *)local_68._M_head_impl != (PKCS12 *)0x0;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((PKCS12 *)local_68._M_head_impl == (PKCS12 *)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_b0,(AssertionResult *)0x57ee15,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x45,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
LAB_00356e44:
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    _Var2._M_head_impl = local_a0._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      _Var2._M_head_impl = local_a0._M_head_impl;
    }
LAB_00356e6e:
    if (_Var2._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  else {
    iVar1 = PKCS12_verify_mac((PKCS12 *)local_68._M_head_impl,"badpass",7);
    local_b0._M_head_impl._0_1_ = iVar1 == 0;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_b0,
                 (AssertionResult *)"PKCS12_verify_mac(p12.get(), \"badpass\", 7)","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x47,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
      goto LAB_00356e44;
    }
    iVar1 = PKCS12_verify_mac((PKCS12 *)local_68._M_head_impl,"foo",3);
    local_b0._M_head_impl._0_1_ = iVar1 != 0;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_b0,
                 (AssertionResult *)"PKCS12_verify_mac(p12.get(), kPassword, sizeof(kPassword) - 1)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x48,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
      goto LAB_00356e44;
    }
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90.data_ = (AssertHelperData *)0x0;
    local_38._M_head_impl = (stack_st_X509 *)0x0;
    iVar1 = PKCS12_parse((PKCS12 *)local_68._M_head_impl,"foo",(EVP_PKEY **)&local_a0,
                         (X509 **)&local_90,(stack_st_X509 **)&local_38);
    local_b0._M_head_impl._0_1_ = iVar1 != 0;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_b0,
                 (AssertionResult *)"PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x4d,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      _Var2._M_head_impl = local_58._M_head_impl;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
        _Var2._M_head_impl = local_58._M_head_impl;
      }
      goto LAB_00356e6e;
    }
    local_58._M_head_impl = local_a0._M_head_impl;
    local_50._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)local_90.data_;
    local_48._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)local_38._M_head_impl;
    local_b0._M_head_impl._0_1_ =
         local_a0._M_head_impl !=
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_a0._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_88,(internal *)&local_b0,(AssertionResult *)0x607821,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x53,(char *)CONCAT71(local_88._1_7_,local_88[0]));
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
LAB_003571a5:
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_a8;
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
      }
      local_80 = local_a8;
      if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_00357243:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,local_80);
      }
    }
    else {
      local_b0._M_head_impl._0_1_ = local_90.data_ != (AssertHelperData *)0x0;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_90.data_ == (AssertHelperData *)0x0) {
        testing::Message::Message((Message *)&local_98);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_88,(internal *)&local_b0,(AssertionResult *)0x5c6cd4,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x54,(char *)CONCAT71(local_88._1_7_,local_88[0]));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
        goto LAB_003571a5;
      }
      local_98.data_._0_4_ = 0;
      local_b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           OPENSSL_sk_num((OPENSSL_STACK *)local_38._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_88,"0u","sk_X509_num(ca_certs)",(uint *)&local_98,
                 (unsigned_long *)&local_b0);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b0);
        if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x55,message);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80;
        goto LAB_00357243;
      }
    }
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_48);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_58);
  }
  std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&local_68);
LAB_00356e95:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS12Test, TestWindowsCompat) {
  std::string data = GetTestData("crypto/pkcs8/test/windows.p12");
  TestCompat(bssl::StringAsBytes(data));
}